

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeVariables
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  cmOutputConverter *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  string cmakeShellCommand;
  string local_80;
  string local_60;
  string local_40;
  
  WriteDivider(this,makefileStream);
  poVar2 = std::operator<<(makefileStream,"# Set environment variables for the build.\n");
  std::operator<<(poVar2,"\n");
  if ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].MakeSilentFlag.
      field_2._M_local_buf[0] == '\x01') {
    poVar2 = std::operator<<(makefileStream,"!IF \"$(OS)\" == \"Windows_NT\"\n");
    poVar2 = std::operator<<(poVar2,"NULL=\n");
    poVar2 = std::operator<<(poVar2,"!ELSE\n");
    poVar2 = std::operator<<(poVar2,"NULL=nul\n");
    std::operator<<(poVar2,"!ENDIF\n");
  }
  bVar1 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
  if (bVar1) {
    pcVar4 = "SHELL = cmd.exe\n";
    poVar2 = makefileStream;
  }
  else {
    poVar2 = std::operator<<(makefileStream,"# The shell in which to execute make rules.\n");
    pcVar4 = "SHELL = /bin/sh\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,"\n");
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  MaybeConvertWatcomShellCommand(&local_40,this,psVar3);
  if (local_40._M_string_length == 0) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmsys::SystemTools::CollapseFullPath(&local_80,psVar3);
    cmOutputConverter::ConvertToOutputFormat
              (&local_60,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_80,SHELL);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  poVar2 = std::operator<<(makefileStream,"# The CMake executable.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_COMMAND = ");
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,"# The command to remove a file.\n");
  poVar2 = std::operator<<(poVar2,"RM = ");
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2," -E remove -f\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,"# Escaping for special characters.\n");
  poVar2 = std::operator<<(poVar2,"EQUALS = =\n");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(makefileStream,
                           "# The top-level source directory on which CMake was run.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_SOURCE_DIR = ");
  psVar3 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmsys::SystemTools::CollapseFullPath(&local_80,psVar3);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&local_60,this_00,&local_80,SHELL);
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  poVar2 = std::operator<<(makefileStream,
                           "# The top-level build directory on which CMake was run.\n");
  poVar2 = std::operator<<(poVar2,"CMAKE_BINARY_DIR = ");
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmsys::SystemTools::CollapseFullPath(&local_80,psVar3);
  cmOutputConverter::ConvertToOutputFormat(&local_60,this_00,&local_80,SHELL);
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeVariables(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Set environment variables for the build.\n"
                 << "\n";
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (gg->DefineWindowsNULL) {
    makefileStream << "!IF \"$(OS)\" == \"Windows_NT\"\n"
                   << "NULL=\n"
                   << "!ELSE\n"
                   << "NULL=nul\n"
                   << "!ENDIF\n";
  }
  if (this->IsWindowsShell()) {
    makefileStream << "SHELL = cmd.exe\n"
                   << "\n";
  } else {
#if !defined(__VMS)
    /* clang-format off */
      makefileStream
        << "# The shell in which to execute make rules.\n"
        << "SHELL = /bin/sh\n"
        << "\n";
/* clang-format on */
#endif
  }

  std::string cmakeShellCommand =
    this->MaybeConvertWatcomShellCommand(cmSystemTools::GetCMakeCommand());
  if (cmakeShellCommand.empty()) {
    cmakeShellCommand = this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  /* clang-format off */
  makefileStream
    << "# The CMake executable.\n"
    << "CMAKE_COMMAND = "
    << cmakeShellCommand
    << "\n"
    << "\n";
  makefileStream
    << "# The command to remove a file.\n"
    << "RM = "
    << cmakeShellCommand
    << " -E remove -f\n"
    << "\n";
  makefileStream
    << "# Escaping for special characters.\n"
    << "EQUALS = =\n"
    << "\n";
  makefileStream
    << "# The top-level source directory on which CMake was run.\n"
    << "CMAKE_SOURCE_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetSourceDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  makefileStream
    << "# The top-level build directory on which CMake was run.\n"
    << "CMAKE_BINARY_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetBinaryDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  /* clang-format on */
}